

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cf-socket.c
# Opt level: O0

void cf_socket_close(Curl_cfilter *cf,Curl_easy *data)

{
  void *pvVar1;
  cf_socket_ctx *ctx;
  Curl_easy *data_local;
  Curl_cfilter *cf_local;
  
  pvVar1 = cf->ctx;
  if ((pvVar1 != (void *)0x0) && (*(int *)((long)pvVar1 + 0x98) != -1)) {
    if (((data != (Curl_easy *)0x0) && ((*(ulong *)&(data->set).field_0x8ca >> 0x1c & 1) != 0)) &&
       (((((data->state).feat == (curl_trc_feat *)0x0 || (0 < ((data->state).feat)->log_level)) &&
         (cf != (Curl_cfilter *)0x0)) && (0 < cf->cft->log_level)))) {
      Curl_trc_cf_infof(data,cf,"cf_socket_close(%d)",(ulong)*(uint *)((long)pvVar1 + 0x98));
    }
    if (*(int *)((long)pvVar1 + 0x98) == cf->conn->sock[cf->sockindex]) {
      cf->conn->sock[cf->sockindex] = -1;
    }
    socket_close(data,cf->conn,(uint)(((*(byte *)((long)pvVar1 + 0x134) >> 2 & 1) != 0 ^ 0xffU) & 1)
                 ,*(curl_socket_t *)((long)pvVar1 + 0x98));
    *(undefined4 *)((long)pvVar1 + 0x98) = 0xffffffff;
    if (((*(byte *)((long)pvVar1 + 0x134) >> 4 & 1) != 0) && (cf->sockindex == 0)) {
      cf->conn->remote_addr = (Curl_sockaddr_ex *)0x0;
    }
    *(byte *)((long)pvVar1 + 0x134) = *(byte *)((long)pvVar1 + 0x134) & 0xef;
    memset((void *)((long)pvVar1 + 0x100),0,0x10);
    memset((void *)((long)pvVar1 + 0x110),0,0x10);
  }
  cf->field_0x24 = cf->field_0x24 & 0xfe;
  return;
}

Assistant:

static void cf_socket_close(struct Curl_cfilter *cf, struct Curl_easy *data)
{
  struct cf_socket_ctx *ctx = cf->ctx;

  if(ctx && CURL_SOCKET_BAD != ctx->sock) {
    CURL_TRC_CF(data, cf, "cf_socket_close(%" FMT_SOCKET_T ")", ctx->sock);
    if(ctx->sock == cf->conn->sock[cf->sockindex])
      cf->conn->sock[cf->sockindex] = CURL_SOCKET_BAD;
    socket_close(data, cf->conn, !ctx->accepted, ctx->sock);
    ctx->sock = CURL_SOCKET_BAD;
    if(ctx->active && cf->sockindex == FIRSTSOCKET)
      cf->conn->remote_addr = NULL;
    ctx->active = FALSE;
    memset(&ctx->started_at, 0, sizeof(ctx->started_at));
    memset(&ctx->connected_at, 0, sizeof(ctx->connected_at));
  }

  cf->connected = FALSE;
}